

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

MemNode * asmjit::vMemMgrCreateNode(VMemMgr *self,size_t size,size_t density)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  size_t *__s;
  size_t in_RDX;
  uint8_t *data;
  MemNode *node;
  size_t bsize;
  size_t blocks;
  uint8_t *vmem;
  size_t vSize;
  uint32_t flags;
  undefined8 in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  MemNode *local_60;
  
  puVar1 = (uint8_t *)
           OSUtils::allocVirtualMemory
                     (in_RDX,in_stack_ffffffffffffff80,
                      (uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (puVar1 == (uint8_t *)0x0) {
    local_60 = (MemNode *)0x0;
  }
  else {
    uVar2 = (ulong)in_stack_ffffffffffffff80 / in_RDX;
    uVar3 = (uVar2 + 7 >> 3) + 7 & 0xfffffffffffffff8;
    local_60 = (MemNode *)malloc(0x68);
    __s = (size_t *)malloc(uVar3 << 1);
    if ((local_60 == (MemNode *)0x0) || (__s == (size_t *)0x0)) {
      OSUtils::releaseVirtualMemory(__s,0x1fa185);
      if (local_60 != (MemNode *)0x0) {
        free(local_60);
      }
      if (__s != (size_t *)0x0) {
        free(__s);
      }
      local_60 = (MemNode *)0x0;
    }
    else {
      (local_60->super_RbNode).node[0] = (RbNode *)0x0;
      (local_60->super_RbNode).node[1] = (RbNode *)0x0;
      (local_60->super_RbNode).mem = puVar1;
      (local_60->super_RbNode).red = 1;
      local_60->prev = (MemNode *)0x0;
      local_60->next = (MemNode *)0x0;
      local_60->size = (size_t)in_stack_ffffffffffffff80;
      local_60->used = 0;
      local_60->blocks = uVar2;
      local_60->density = in_RDX;
      local_60->largestBlock = (size_t)in_stack_ffffffffffffff80;
      memset(__s,0,uVar3 << 1);
      local_60->baUsed = __s;
      local_60->baCont = (size_t *)((long)__s + uVar3);
    }
  }
  return local_60;
}

Assistant:

static MemNode* vMemMgrCreateNode(VMemMgr* self, size_t size, size_t density) noexcept {
  size_t vSize;
  uint8_t* vmem = vMemMgrAllocVMem(self, size, &vSize);
  if (!vmem) return nullptr;

  size_t blocks = (vSize / density);
  size_t bsize = (((blocks + 7) >> 3) + sizeof(size_t) - 1) & ~(size_t)(sizeof(size_t) - 1);

  MemNode* node = static_cast<MemNode*>(Internal::allocMemory(sizeof(MemNode)));
  uint8_t* data = static_cast<uint8_t*>(Internal::allocMemory(bsize * 2));

  // Out of memory.
  if (!node || !data) {
    vMemMgrReleaseVMem(self, vmem, vSize);
    if (node) Internal::releaseMemory(node);
    if (data) Internal::releaseMemory(data);
    return nullptr;
  }

  // Initialize RbNode data.
  node->node[0] = nullptr;
  node->node[1] = nullptr;
  node->mem = vmem;
  node->red = 1;

  // Initialize MemNode data.
  node->prev = nullptr;
  node->next = nullptr;

  node->size = vSize;
  node->used = 0;
  node->blocks = blocks;
  node->density = density;
  node->largestBlock = vSize;

  ::memset(data, 0, bsize * 2);
  node->baUsed = reinterpret_cast<size_t*>(data);
  node->baCont = reinterpret_cast<size_t*>(data + bsize);

  return node;
}